

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *input)

{
  int iVar1;
  value_type local_80;
  value_type local_60;
  size_type local_40;
  size_type end;
  size_type start;
  allocator<char> local_19;
  string *local_18;
  string *input_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *results;
  
  local_18 = input;
  input_local = (string *)__return_storage_ptr__;
  if ((split(std::__cxx11::string_const&)::delims_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&split(std::__cxx11::string_const&)::delims_abi_cxx11_),
     iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&split(std::__cxx11::string_const&)::delims_abi_cxx11_," \t\n\f\r",
               &local_19);
    std::allocator<char>::~allocator(&local_19);
    __cxa_atexit(std::__cxx11::string::~string,
                 &split(std::__cxx11::string_const&)::delims_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&split(std::__cxx11::string_const&)::delims_abi_cxx11_);
  }
  start._3_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  end = 0;
  while (end = std::__cxx11::string::find_first_not_of((string *)local_18,0x135e08),
        end != 0xffffffffffffffff) {
    local_40 = std::__cxx11::string::find_first_of((string *)local_18,0x135e08);
    if (local_40 == 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)local_18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      end = 0xffffffffffffffff;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_60,(ulong)local_18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      end = local_40;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <std::string> split (const std::string& input)
{
  static std::string delims = " \t\n\f\r";
  std::vector <std::string> results;

  std::string::size_type start = 0;
  std::string::size_type end;
  while ((start = input.find_first_not_of (delims, start)) != std::string::npos)
  {
    if ((end = input.find_first_of (delims, start)) != std::string::npos)
    {
      results.push_back (input.substr (start, end - start));
      start = end;
    }
    else
    {
      results.push_back (input.substr (start));
      start = std::string::npos;
    }
  }

  return results;
}